

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_info.hpp
# Opt level: O3

void __thiscall duckdb::ChangeOwnershipInfo::ChangeOwnershipInfo(ChangeOwnershipInfo *this)

{
  *(undefined2 *)&(this->super_AlterInfo).super_ParseInfo.info_type = 0x400;
  (this->super_AlterInfo).catalog._M_dataplus._M_p =
       (pointer)&(this->super_AlterInfo).catalog.field_2;
  (this->super_AlterInfo).catalog._M_string_length = 0;
  (this->super_AlterInfo).catalog.field_2._M_local_buf[0] = '\0';
  (this->super_AlterInfo).schema._M_dataplus._M_p = (pointer)&(this->super_AlterInfo).schema.field_2
  ;
  (this->super_AlterInfo).schema._M_string_length = 0;
  (this->super_AlterInfo).schema.field_2._M_local_buf[0] = '\0';
  (this->super_AlterInfo).name._M_dataplus._M_p = (pointer)&(this->super_AlterInfo).name.field_2;
  (this->super_AlterInfo).name._M_string_length = 0;
  (this->super_AlterInfo).name.field_2._M_local_buf[0] = '\0';
  (this->super_AlterInfo).super_ParseInfo._vptr_ParseInfo =
       (_func_int **)&PTR__ChangeOwnershipInfo_01980b38;
  (this->owner_schema)._M_dataplus._M_p = (pointer)&(this->owner_schema).field_2;
  (this->owner_schema)._M_string_length = 0;
  (this->owner_schema).field_2._M_local_buf[0] = '\0';
  (this->owner_name)._M_dataplus._M_p = (pointer)&(this->owner_name).field_2;
  (this->owner_name)._M_string_length = 0;
  (this->owner_name).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

explicit ParseInfo(ParseInfoType info_type) : info_type(info_type) {
	}